

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O2

short * vrna_seq_encode_simple(char *sequence,vrna_md_t *md)

{
  int iVar1;
  size_t sVar2;
  short *psVar3;
  ulong uVar4;
  
  if (md == (vrna_md_t *)0x0 || sequence == (char *)0x0) {
    psVar3 = (short *)0x0;
  }
  else {
    sVar2 = strlen(sequence);
    psVar3 = (short *)vrna_alloc((int)sVar2 * 2 + 4);
    for (uVar4 = 1; uVar4 <= (sVar2 & 0xffffffff); uVar4 = uVar4 + 1) {
      iVar1 = vrna_nucleotide_encode(sequence[uVar4 - 1],md);
      psVar3[uVar4] = (short)iVar1;
    }
    psVar3[(int)sVar2 + 1] = psVar3[1];
    *psVar3 = (short)sVar2;
  }
  return psVar3;
}

Assistant:

PUBLIC short *
vrna_seq_encode_simple(const char *sequence,
                       vrna_md_t  *md)
{
  unsigned int  i, l;
  short         *S = NULL;

  if (sequence && md) {
    l = (unsigned int)strlen(sequence);
    S = (short *)vrna_alloc(sizeof(short) * (l + 2));

    for (i = 1; i <= l; i++) /* make numerical encoding of sequence */
      S[i] = (short)vrna_nucleotide_encode(sequence[i - 1], md);

    S[l + 1]  = S[1];
    S[0]      = (short)l;
  }

  return S;
}